

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O2

void simple_token_chain_append(simple_token *chain_start,simple_token *t)

{
  simple_token *psVar1;
  
  if (t != (simple_token *)0x0 && chain_start != (simple_token *)0x0) {
    psVar1 = chain_start->tail;
    psVar1->next = t;
    t->prev = psVar1;
    chain_start->tail = t->tail;
  }
  return;
}

Assistant:

void simple_token_chain_append(
	simple_token * chain_start,				//!< Pointer to start of token chain
	simple_token * t							//!< Pointer to token to append
) {
	if ((chain_start == NULL) ||
			(t == NULL)) {
		return;
	}

	// Append t
	chain_start->tail->next = t;
	t->prev = chain_start->tail;

	// Adjust tail marker
	chain_start->tail = t->tail;
}